

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldTypesTests::TestDateTime_convertToNanos::RunImpl(TestDateTime_convertToNanos *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_30;
  int local_2c;
  TestDetails local_28;
  
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 1000000000;
  local_30 = 1000000000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x38);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 100000000;
  local_30 = 100000000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x39);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 10000000;
  local_30 = 10000000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x3a);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 1000000;
  local_30 = 1000000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x3b);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 100000;
  local_30 = 100000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x3c);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 10000;
  local_30 = 10000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x3d);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 1000;
  local_30 = 1000;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x3e);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 100;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x3f);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 10;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x40);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 1;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x41);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 1;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x42);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  return;
}

Assistant:

TEST(DateTime_convertToNanos)
{

  CHECK_EQUAL(1000000000,FIX::DateTime::convertToNanos(1,0));
  CHECK_EQUAL(100000000,FIX::DateTime::convertToNanos(1,1));
  CHECK_EQUAL(10000000,FIX::DateTime::convertToNanos(1,2));
  CHECK_EQUAL(1000000,FIX::DateTime::convertToNanos(1,3));
  CHECK_EQUAL(100000,FIX::DateTime::convertToNanos(1,4));
  CHECK_EQUAL(10000,FIX::DateTime::convertToNanos(1,5));
  CHECK_EQUAL(1000,FIX::DateTime::convertToNanos(1,6));
  CHECK_EQUAL(100,FIX::DateTime::convertToNanos(1,7));
  CHECK_EQUAL(10,FIX::DateTime::convertToNanos(1,8));
  CHECK_EQUAL(1,FIX::DateTime::convertToNanos(1,9));
  CHECK_EQUAL(1,FIX::DateTime::convertToNanos(1,25));

}